

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O2

UDataInfo *
getDataInfo(uint8_t *data,int32_t length,int32_t *infoLength,int32_t *headerLength,
           UErrorCode *pErrorCode)

{
  UDataInfo *pUVar1;
  uint uVar2;
  uint16_t uVar3;
  UErrorCode UVar4;
  ushort uVar5;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((uint)length < 0x18 || data == (uint8_t *)0x0) {
      UVar4 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UVar4 = U_UNSUPPORTED_ERROR;
      if (((data[2] == 0xda) && (data[3] == '\'')) && (data[10] == '\x02')) {
        pUVar1 = (UDataInfo *)(data + 4);
        uVar5 = *(ushort *)data;
        if (data[8] == '\0') {
          uVar3 = pUVar1->size;
        }
        else {
          uVar5 = uVar5 << 8 | uVar5 >> 8;
          uVar3 = pUVar1->size << 8 | pUVar1->size >> 8;
        }
        *headerLength = (uint)uVar5;
        *infoLength = (uint)uVar3;
        uVar2 = *headerLength;
        if (((0x17 < (int)uVar2) && (uVar2 <= (uint)length)) &&
           ((0x13 < uVar3 && (uVar3 + 4 <= uVar2)))) {
          return pUVar1;
        }
      }
    }
    *pErrorCode = UVar4;
  }
  return (UDataInfo *)0x0;
}

Assistant:

U_CFUNC const UDataInfo *
getDataInfo(const uint8_t *data, int32_t length,
            int32_t &infoLength, int32_t &headerLength,
            UErrorCode *pErrorCode) {
    const DataHeader *pHeader;
    const UDataInfo *pInfo;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( data==NULL ||
        (length>=0 && length<(int32_t)sizeof(DataHeader))
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    pHeader=(const DataHeader *)data;
    pInfo=&pHeader->info;
    if( (length>=0 && length<(int32_t)sizeof(DataHeader)) ||
        pHeader->dataHeader.magic1!=0xda ||
        pHeader->dataHeader.magic2!=0x27 ||
        pInfo->sizeofUChar!=2
    ) {
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return NULL;
    }

    if(pInfo->isBigEndian==U_IS_BIG_ENDIAN) {
        headerLength=pHeader->dataHeader.headerSize;
        infoLength=pInfo->size;
    } else {
        headerLength=readSwapUInt16(pHeader->dataHeader.headerSize);
        infoLength=readSwapUInt16(pInfo->size);
    }

    if( headerLength<(int32_t)sizeof(DataHeader) ||
        infoLength<(int32_t)sizeof(UDataInfo) ||
        headerLength<(int32_t)(sizeof(pHeader->dataHeader)+infoLength) ||
        (length>=0 && length<headerLength)
    ) {
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return NULL;
    }

    return pInfo;
}